

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O2

void parser_info_cleanup(parser_info_conflict *info)

{
  long lVar1;
  
  if (info->parser != (XML_Parser)0x0) {
    coda_XML_ParserFree(info->parser);
  }
  for (lVar1 = 0; lVar1 <= info->depth; lVar1 = lVar1 + 1) {
    if (info->record[lVar1] != (coda_mem_record *)0x0) {
      coda_dynamic_type_delete((coda_dynamic_type *)info->record[lVar1]);
    }
  }
  if (info->attributes != (coda_dynamic_type *)0x0) {
    coda_dynamic_type_delete(info->attributes);
  }
  free(info->value);
  return;
}

Assistant:

static void parser_info_cleanup(parser_info *info)
{
    int i;

    if (info->parser != NULL)
    {
        XML_ParserFree(info->parser);
    }
    for (i = 0; i <= info->depth; i++)
    {
        if (info->record[i] != NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)info->record[i]);
        }
    }
    if (info->attributes != NULL)
    {
        coda_dynamic_type_delete(info->attributes);
    }
    if (info->value != NULL)
    {
        free(info->value);
    }
}